

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void stable_bitonic_sort(int **dst,size_t size)

{
  int *_sort_swap_temp;
  int *piVar1;
  
  switch(size) {
  case 0:
  case 1:
    break;
  case 2:
    goto switchD_0010ede0_caseD_2;
  case 3:
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    goto switchD_0010ede0_caseD_2;
  case 4:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
LAB_00110178:
      dst[3] = piVar1;
    }
    goto LAB_0011017c;
  case 5:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[3] < *piVar1) {
      *dst = dst[3];
      goto LAB_00110178;
    }
LAB_0011017c:
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
      return;
    }
    break;
  case 6:
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[5] < *piVar1) {
      dst[3] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[5] < *piVar1) {
      dst[2] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[3] < *piVar1) {
      *dst = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    goto LAB_00110303;
  case 7:
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[5] < *piVar1) {
      dst[3] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[3] < *piVar1) {
      *dst = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[5] < *piVar1) {
      dst[2] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    goto LAB_00110303;
  case 8:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[7] < *piVar1) {
      dst[3] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[6] < *piVar1) {
      dst[3] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[5] < *piVar1) {
      dst[3] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
      return;
    }
    break;
  case 9:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[8] < *piVar1) {
      dst[7] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[5] < *piVar1) {
      dst[2] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[3] < *piVar1) {
      *dst = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[8] < *piVar1) {
      dst[5] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[6] < *piVar1) {
      dst[3] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[7] < *piVar1) {
      dst[4] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[5] < *piVar1) {
      dst[2] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[3] < *piVar1) {
      *dst = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
LAB_00110303:
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
      return;
    }
    break;
  case 10:
    piVar1 = dst[4];
    if (*dst[9] < *piVar1) {
      dst[4] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[8] < *piVar1) {
      dst[3] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[7] < *piVar1) {
      dst[2] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[6] < *piVar1) {
      dst[1] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[5] < *piVar1) {
      *dst = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[9] < *piVar1) {
      dst[6] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[3] < *piVar1) {
      *dst = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[8] < *piVar1) {
      dst[5] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[6] < *piVar1) {
      dst[3] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[9] < *piVar1) {
      dst[7] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[8] < *piVar1) {
      dst[7] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[5] < *piVar1) {
      dst[3] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[5] < *piVar1) {
      dst[2] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[8] < *piVar1) {
      dst[6] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[7] < *piVar1) {
      dst[4] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
      return;
    }
    break;
  case 0xb:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[10] < *piVar1) {
      dst[8] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[10] < *piVar1) {
      dst[9] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[7] < *piVar1) {
      dst[3] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[10] < *piVar1) {
      dst[6] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[8] < *piVar1) {
      dst[4] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[9] < *piVar1) {
      dst[5] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    goto LAB_0010f8f8;
  case 0xc:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xb] < *piVar1) {
      dst[10] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xb] < *piVar1) {
      dst[9] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[10] < *piVar1) {
      dst[8] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[10] < *piVar1) {
      dst[9] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xb] < *piVar1) {
      dst[7] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[10] < *piVar1) {
      dst[6] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[7] < *piVar1) {
      dst[3] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[8] < *piVar1) {
      dst[4] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[9] < *piVar1) {
      dst[5] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xb] < *piVar1) {
      dst[7] = dst[0xb];
      dst[0xb] = piVar1;
    }
LAB_0010f8f8:
    piVar1 = dst[3];
    if (*dst[8] < *piVar1) {
      dst[3] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[10] < *piVar1) {
      dst[6] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[10] < *piVar1) {
      dst[7] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[5] < *piVar1) {
      dst[3] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[8] < *piVar1) {
      dst[6] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[9] < *piVar1) {
      dst[7] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[8] < *piVar1) {
      dst[7] = dst[8];
      dst[8] = piVar1;
      return;
    }
    break;
  case 0xd:
    piVar1 = dst[1];
    if (*dst[7] < *piVar1) {
      dst[1] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xb] < *piVar1) {
      dst[9] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[8] < *piVar1) {
      dst[5] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[0xc] < *piVar1) {
      *dst = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[0xb] < *piVar1) {
      dst[8] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xc] < *piVar1) {
      dst[7] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[9] < *piVar1) {
      dst[5] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[7] < *piVar1) {
      dst[3] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xb] < *piVar1) {
      dst[10] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[0xc] < *piVar1) {
      dst[6] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[8] < *piVar1) {
      dst[7] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[0xb];
    if (*dst[0xc] < *piVar1) {
      dst[0xb] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[9] < *piVar1) {
      dst[4] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[10] < *piVar1) {
      dst[6] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xb] < *piVar1) {
      dst[10] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[7] < *piVar1) {
      dst[1] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xb] < *piVar1) {
      dst[9] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[7] < *piVar1) {
      dst[4] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[10] < *piVar1) {
      dst[8] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[5] < *piVar1) {
      *dst = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[5] < *piVar1) {
      dst[2] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[8] < *piVar1) {
      dst[6] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[10] < *piVar1) {
      dst[9] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[5] < *piVar1) {
      dst[3] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[8] < *piVar1) {
      dst[7] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
      return;
    }
    break;
  case 0xe:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xb] < *piVar1) {
      dst[10] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[0xc];
    if (*dst[0xd] < *piVar1) {
      dst[0xc] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[10] < *piVar1) {
      dst[8] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xb] < *piVar1) {
      dst[9] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[0xc] < *piVar1) {
      dst[8] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xd] < *piVar1) {
      dst[9] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[7] < *piVar1) {
      dst[3] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[8] < *piVar1) {
      *dst = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[9] < *piVar1) {
      dst[1] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[10] < *piVar1) {
      dst[2] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[0xb] < *piVar1) {
      dst[3] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[0xc] < *piVar1) {
      dst[4] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[0xd] < *piVar1) {
      dst[5] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[10] < *piVar1) {
      dst[5] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[9] < *piVar1) {
      dst[6] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[0xc] < *piVar1) {
      dst[3] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xb] < *piVar1) {
      dst[7] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[8] < *piVar1) {
      dst[4] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xd] < *piVar1) {
      dst[7] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[8] < *piVar1) {
      dst[2] = dst[8];
      dst[8] = piVar1;
    }
    goto LAB_0010ffd7;
  case 0xf:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xb] < *piVar1) {
      dst[10] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[0xc];
    if (*dst[0xd] < *piVar1) {
      dst[0xc] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[10] < *piVar1) {
      dst[8] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[0xc];
    if (*dst[0xe] < *piVar1) {
      dst[0xc] = dst[0xe];
      dst[0xe] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xb] < *piVar1) {
      dst[9] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[0xc] < *piVar1) {
      dst[8] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xd] < *piVar1) {
      dst[9] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xe] < *piVar1) {
      dst[10] = dst[0xe];
      dst[0xe] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[7] < *piVar1) {
      dst[3] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[8] < *piVar1) {
      *dst = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[9] < *piVar1) {
      dst[1] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[10] < *piVar1) {
      dst[2] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[0xb] < *piVar1) {
      dst[3] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[0xc] < *piVar1) {
      dst[4] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[0xd] < *piVar1) {
      dst[5] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[0xe] < *piVar1) {
      dst[6] = dst[0xe];
      dst[0xe] = piVar1;
    }
    goto LAB_0010fee5;
  case 0x10:
    piVar1 = *dst;
    if (*dst[1] < *piVar1) {
      *dst = dst[1];
      dst[1] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[3] < *piVar1) {
      dst[2] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[5] < *piVar1) {
      dst[4] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xb] < *piVar1) {
      dst[10] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[0xc];
    if (*dst[0xd] < *piVar1) {
      dst[0xc] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[0xe];
    if (*dst[0xf] < *piVar1) {
      dst[0xe] = dst[0xf];
      dst[0xf] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[2] < *piVar1) {
      *dst = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[6] < *piVar1) {
      dst[4] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[10] < *piVar1) {
      dst[8] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[0xc];
    if (*dst[0xe] < *piVar1) {
      dst[0xc] = dst[0xe];
      dst[0xe] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[3] < *piVar1) {
      dst[1] = dst[3];
      dst[3] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[7] < *piVar1) {
      dst[5] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xb] < *piVar1) {
      dst[9] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[0xd];
    if (*dst[0xf] < *piVar1) {
      dst[0xd] = dst[0xf];
      dst[0xf] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[4] < *piVar1) {
      *dst = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[0xc] < *piVar1) {
      dst[8] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[5] < *piVar1) {
      dst[1] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[0xd] < *piVar1) {
      dst[9] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[6] < *piVar1) {
      dst[2] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xe] < *piVar1) {
      dst[10] = dst[0xe];
      dst[0xe] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[7] < *piVar1) {
      dst[3] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[0xb];
    if (*dst[0xf] < *piVar1) {
      dst[0xb] = dst[0xf];
      dst[0xf] = piVar1;
    }
    piVar1 = *dst;
    if (*dst[8] < *piVar1) {
      *dst = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[9] < *piVar1) {
      dst[1] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[10] < *piVar1) {
      dst[2] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[0xb] < *piVar1) {
      dst[3] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[0xc] < *piVar1) {
      dst[4] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[0xd] < *piVar1) {
      dst[5] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[0xe] < *piVar1) {
      dst[6] = dst[0xe];
      dst[0xe] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xf] < *piVar1) {
      dst[7] = dst[0xf];
      dst[0xf] = piVar1;
    }
LAB_0010fee5:
    piVar1 = dst[5];
    if (*dst[10] < *piVar1) {
      dst[5] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[9] < *piVar1) {
      dst[6] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[0xc] < *piVar1) {
      dst[3] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[0xd];
    if (*dst[0xe] < *piVar1) {
      dst[0xd] = dst[0xe];
      dst[0xe] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xb] < *piVar1) {
      dst[7] = dst[0xb];
      dst[0xb] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[2] < *piVar1) {
      dst[1] = dst[2];
      dst[2] = piVar1;
    }
    piVar1 = dst[4];
    if (*dst[8] < *piVar1) {
      dst[4] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[1];
    if (*dst[4] < *piVar1) {
      dst[1] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xd] < *piVar1) {
      dst[7] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[8] < *piVar1) {
      dst[2] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[0xb];
    if (*dst[0xe] < *piVar1) {
      dst[0xb] = dst[0xe];
      dst[0xe] = piVar1;
    }
LAB_0010ffd7:
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[10] < *piVar1) {
      dst[9] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[2];
    if (*dst[4] < *piVar1) {
      dst[2] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[0xb];
    if (*dst[0xd] < *piVar1) {
      dst[0xb] = dst[0xd];
      dst[0xd] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[8] < *piVar1) {
      dst[3] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[0xc] < *piVar1) {
      dst[7] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[8] < *piVar1) {
      dst[6] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[10];
    if (*dst[0xc] < *piVar1) {
      dst[10] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[5] < *piVar1) {
      dst[3] = dst[5];
      dst[5] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[9] < *piVar1) {
      dst[7] = dst[9];
      dst[9] = piVar1;
    }
    piVar1 = dst[3];
    if (*dst[4] < *piVar1) {
      dst[3] = dst[4];
      dst[4] = piVar1;
    }
    piVar1 = dst[5];
    if (*dst[6] < *piVar1) {
      dst[5] = dst[6];
      dst[6] = piVar1;
    }
    piVar1 = dst[7];
    if (*dst[8] < *piVar1) {
      dst[7] = dst[8];
      dst[8] = piVar1;
    }
    piVar1 = dst[9];
    if (*dst[10] < *piVar1) {
      dst[9] = dst[10];
      dst[10] = piVar1;
    }
    piVar1 = dst[0xb];
    if (*dst[0xc] < *piVar1) {
      dst[0xb] = dst[0xc];
      dst[0xc] = piVar1;
    }
    piVar1 = dst[6];
    if (*dst[7] < *piVar1) {
      dst[6] = dst[7];
      dst[7] = piVar1;
    }
    piVar1 = dst[8];
    if (*dst[9] < *piVar1) {
      dst[8] = dst[9];
      dst[9] = piVar1;
      return;
    }
    break;
  default:
    if (1 < size) {
      stable_binary_insertion_sort_start(dst,1,size);
      return;
    }
  }
  return;
switchD_0010ede0_caseD_2:
  piVar1 = *dst;
  if (*piVar1 <= *dst[1]) {
    return;
  }
  *dst = dst[1];
  dst[1] = piVar1;
  return;
}

Assistant:

void BITONIC_SORT(SORT_TYPE *dst, const size_t size) {
  switch (size) {
  case 0:
  case 1:
    break;

  case 2:
    BITONIC_SORT_2(dst);
    break;

  case 3:
    BITONIC_SORT_3(dst);
    break;

  case 4:
    BITONIC_SORT_4(dst);
    break;

  case 5:
    BITONIC_SORT_5(dst);
    break;

  case 6:
    BITONIC_SORT_6(dst);
    break;

  case 7:
    BITONIC_SORT_7(dst);
    break;

  case 8:
    BITONIC_SORT_8(dst);
    break;

  case 9:
    BITONIC_SORT_9(dst);
    break;

  case 10:
    BITONIC_SORT_10(dst);
    break;

  case 11:
    BITONIC_SORT_11(dst);
    break;

  case 12:
    BITONIC_SORT_12(dst);
    break;

  case 13:
    BITONIC_SORT_13(dst);
    break;

  case 14:
    BITONIC_SORT_14(dst);
    break;

  case 15:
    BITONIC_SORT_15(dst);
    break;

  case 16:
    BITONIC_SORT_16(dst);
    break;

  default:
    BINARY_INSERTION_SORT(dst, size);
  }
}